

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O1

void Rml::PluginRegistry::NotifyElementCreate(Element *element)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *puVar4;
  
  if (plugin_vectors._8_8_ == 0) {
    bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x46);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  puVar1 = *(undefined8 **)(plugin_vectors._8_8_ + 0x38);
  for (puVar4 = *(undefined8 **)(plugin_vectors._8_8_ + 0x30); puVar4 != puVar1; puVar4 = puVar4 + 1
      ) {
    (**(code **)(*(long *)*puVar4 + 0x50))((long *)*puVar4,element);
  }
  return;
}

Assistant:

void PluginRegistry::NotifyElementCreate(Element* element)
{
	for (Plugin* plugin : plugin_vectors->element)
		plugin->OnElementCreate(element);
}